

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

t_symbol * canvas_realizedollar(_glist *x,t_symbol *s)

{
  char *pcVar1;
  _canvasenvironment *p_Var2;
  
  pcVar1 = strchr(s->s_name,0x24);
  if (pcVar1 != (char *)0x0) {
    p_Var2 = canvas_getenv(x);
    pd_pushsym((t_pd *)x);
    s = binbuf_realizedollsym(s,p_Var2->ce_argc,p_Var2->ce_argv,1);
    pd_popsym((t_pd *)x);
  }
  return s;
}

Assistant:

t_symbol *canvas_realizedollar(t_canvas *x, t_symbol *s)
{
    t_symbol *ret;
    const char *name = s->s_name;
    if (strchr(name, '$'))
    {
        t_canvasenvironment *env = canvas_getenv(x);
        canvas_setcurrent(x);
        ret = binbuf_realizedollsym(s, env->ce_argc, env->ce_argv, 1);
        canvas_unsetcurrent(x);
    }
    else ret = s;
    return (ret);
}